

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlGrowNsCache(xmlNsCache **cache,int *capacity)

{
  uint uVar1;
  xmlNsCache *pxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *capacity;
  iVar3 = -1;
  if ((int)uVar1 < 1) {
    uVar5 = 10;
  }
  else {
    if (999999999 < uVar1) {
      return -1;
    }
    uVar4 = uVar1 + 1 >> 1;
    uVar5 = uVar4 + uVar1;
    if (1000000000 - uVar4 < uVar1) {
      uVar5 = 1000000000;
    }
  }
  pxVar2 = (xmlNsCache *)(*xmlRealloc)(*cache,(ulong)uVar5 << 4);
  if (pxVar2 != (xmlNsCache *)0x0) {
    *cache = pxVar2;
    *capacity = uVar5;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlGrowNsCache(xmlNsCache **cache, int *capacity) {
    xmlNsCache *tmp;
    int newSize;

    newSize = xmlGrowCapacity(*capacity, sizeof(tmp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(*cache, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);
    *cache = tmp;
    *capacity = newSize;

    return(0);
}